

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanLogicalDevice.cpp
# Opt level: O1

ImageWrapper * __thiscall
VulkanUtilities::VulkanLogicalDevice::CreateImage
          (ImageWrapper *__return_storage_ptr__,VulkanLogicalDevice *this,VkImageCreateInfo *ImageCI
          ,char *DebugName)

{
  string msg;
  string local_48;
  
  if (ImageCI->sType != VK_STRUCTURE_TYPE_IMAGE_CREATE_INFO) {
    Diligent::FormatString<char[26],char[53]>
              (&local_48,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"ImageCI.sType == VK_STRUCTURE_TYPE_IMAGE_CREATE_INFO",
               (char (*) [53])DebugName);
    Diligent::DebugAssertionFailed
              (local_48._M_dataplus._M_p,"CreateImage",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/VulkanUtilities/VulkanLogicalDevice.cpp"
               ,0xcd);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
    }
  }
  CreateVulkanObject<VkImage_T*,(VulkanUtilities::VulkanHandleTypeId)4,VkResult(*)(VkDevice_T*,VkImageCreateInfo_const*,VkAllocationCallbacks_const*,VkImage_T**),VkImageCreateInfo>
            (__return_storage_ptr__,this,
             (_func_VkResult_VkDevice_T_ptr_VkImageCreateInfo_ptr_VkAllocationCallbacks_ptr_VkImage_T_ptr_ptr
              *)vkCreateImage,ImageCI,DebugName,"image");
  return __return_storage_ptr__;
}

Assistant:

ImageWrapper VulkanLogicalDevice::CreateImage(const VkImageCreateInfo& ImageCI,
                                              const char*              DebugName) const
{
    VERIFY_EXPR(ImageCI.sType == VK_STRUCTURE_TYPE_IMAGE_CREATE_INFO);
    return CreateVulkanObject<VkImage, VulkanHandleTypeId::Image>(vkCreateImage, ImageCI, DebugName, "image");
}